

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

char * qstrncpy(char *dst,char *src,size_t len)

{
  if ((len != 0 && dst != (char *)0x0) && (*dst = '\0', src != (char *)0x0)) {
    strncat(dst,src,len - 1);
  }
  if (src == (char *)0x0) {
    dst = (char *)0x0;
  }
  return dst;
}

Assistant:

char *qstrncpy(char *dst, const char *src, size_t len)
{
    if (dst && len > 0) {
        *dst = '\0';
        if (src)
            std::strncat(dst, src, len - 1);
    }
    return src ? dst : nullptr;
}